

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall
icu_63::Calendar::set
          (Calendar *this,int32_t year,int32_t month,int32_t date,int32_t hour,int32_t minute,
          int32_t second)

{
  int32_t minute_local;
  int32_t hour_local;
  int32_t date_local;
  int32_t month_local;
  int32_t year_local;
  Calendar *this_local;
  
  set(this,UCAL_YEAR,year);
  set(this,UCAL_MONTH,month);
  set(this,UCAL_DATE,date);
  set(this,UCAL_HOUR_OF_DAY,hour);
  set(this,UCAL_MINUTE,minute);
  set(this,UCAL_SECOND,second);
  return;
}

Assistant:

void
Calendar::set(int32_t year, int32_t month, int32_t date, int32_t hour, int32_t minute, int32_t second)
{
    set(UCAL_YEAR, year);
    set(UCAL_MONTH, month);
    set(UCAL_DATE, date);
    set(UCAL_HOUR_OF_DAY, hour);
    set(UCAL_MINUTE, minute);
    set(UCAL_SECOND, second);
}